

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O1

bech32_error bech32_decode(bech32_DecodedResult *decodedResult,char *str)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  unsigned_long __n2;
  bech32_error bVar4;
  DecodedResult localResult;
  string inputStr;
  undefined1 *local_c8;
  ulong local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  pointer local_a8;
  pointer puStack_a0;
  pointer local_98;
  string local_90;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer puStack_40;
  pointer puStack_38;
  
  bVar4 = E_BECH32_NULL_ARGUMENT;
  if ((((decodedResult != (bech32_DecodedResult *)0x0) && (decodedResult->hrp != (char *)0x0)) &&
      (str != (char *)0x0)) && (decodedResult->dp != (uchar *)0x0)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    sVar3 = strlen(str);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,str,str + sVar3);
    local_c0 = 0;
    local_b8 = 0;
    local_a8 = (pointer)0x0;
    puStack_a0 = (pointer)0x0;
    local_98 = (pointer)0x0;
    local_c8 = &local_b8;
    bech32::decode((DecodedResult *)local_70,&local_90);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_68);
    puVar2 = local_98;
    puVar1 = local_a8;
    local_a8 = local_48;
    puStack_a0 = puStack_40;
    local_98 = puStack_38;
    local_48 = (pointer)0x0;
    puStack_40 = (pointer)0x0;
    puStack_38 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)puStack_38 - (long)local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    if ((local_c0 == 0) && (local_a8 == puStack_a0)) {
      bVar4 = E_BECH32_INVALID_CHECKSUM;
    }
    else {
      bVar4 = E_BECH32_LENGTH_TOO_SHORT;
      if ((local_c0 <= decodedResult->hrplen) &&
         ((ulong)((long)puStack_a0 - (long)local_a8) <= decodedResult->dplen)) {
        decodedResult->encoding = local_70._0_4_;
        if (local_c0 != 0) {
          memmove(decodedResult->hrp,local_c8,local_c0);
        }
        decodedResult->hrp[local_c0] = '\0';
        bVar4 = E_BECH32_SUCCESS;
        if ((long)puStack_a0 - (long)local_a8 != 0) {
          memmove(decodedResult->dp,local_a8,(long)puStack_a0 - (long)local_a8);
          bVar4 = E_BECH32_SUCCESS;
        }
      }
    }
    if (local_a8 != (pointer)0x0) {
      operator_delete(local_a8,(long)local_98 - (long)local_a8);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bech32_error bech32_decode(bech32_DecodedResult *decodedResult, char const *str) {

    if(decodedResult == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(decodedResult->hrp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(decodedResult->dp == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(str == nullptr)
        return E_BECH32_NULL_ARGUMENT;

    std::string inputStr(str);

    bech32::DecodedResult localResult;
    try {
        localResult = bech32::decode(inputStr);
    } catch (std::exception &) {
        // todo: convert exception message
        return E_BECH32_UNKNOWN_ERROR;
    }

    if(localResult.hrp.empty() && localResult.dp.empty())
        return E_BECH32_INVALID_CHECKSUM;

    if(localResult.hrp.size() > decodedResult->hrplen)
        return E_BECH32_LENGTH_TOO_SHORT;
    if(localResult.dp.size() > decodedResult->dplen)
        return E_BECH32_LENGTH_TOO_SHORT;

    decodedResult->encoding = static_cast<bech32_encoding>(localResult.encoding);
    std::copy_n(localResult.hrp.begin(), localResult.hrp.size(), decodedResult->hrp);
    decodedResult->hrp[localResult.hrp.size()] = '\0';
    std::copy_n(localResult.dp.begin(), localResult.dp.size(), decodedResult->dp);

    return E_BECH32_SUCCESS;
}